

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<
          (AssertionResult *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  wstring *in_stack_ffffffffffffffe8;
  
  Message::Message(in_RSI);
  Message::operator<<(in_RSI,in_stack_ffffffffffffffe8);
  AppendMessage(this,(Message *)value);
  Message::~Message((Message *)0x18e848);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }